

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O0

GLXContext glfwGetGLXContext(GLFWwindow *handle)

{
  _GLFWwindow *window;
  GLFWwindow *handle_local;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    handle_local = (GLFWwindow *)0x0;
  }
  else if (_glfw.platform.platformID == 0x60004) {
    if (*(int *)(handle + 0x20c) == 0x36001) {
      handle_local = *(GLFWwindow **)(handle + 0x2b8);
    }
    else {
      _glfwInputError(0x1000a,(char *)0x0);
      handle_local = (GLFWwindow *)0x0;
    }
  }
  else {
    _glfwInputError(0x1000e,"GLX: Platform not initialized");
    handle_local = (GLFWwindow *)0x0;
  }
  return (GLXContext)handle_local;
}

Assistant:

GLFWAPI GLXContext glfwGetGLXContext(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (_glfw.platform.platformID != GLFW_PLATFORM_X11)
    {
        _glfwInputError(GLFW_PLATFORM_UNAVAILABLE, "GLX: Platform not initialized");
        return NULL;
    }

    if (window->context.source != GLFW_NATIVE_CONTEXT_API)
    {
        _glfwInputError(GLFW_NO_WINDOW_CONTEXT, NULL);
        return NULL;
    }

    return window->context.glx.handle;
}